

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpmr.cpp
# Opt level: O0

void __thiscall DSDcc::DSDdPMR::processVoiceFrame(DSDdPMR *this,int symbolIndex,int dibit)

{
  DSDLogger *pDVar1;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  double __x;
  double __x_00;
  DSDdPMR *unaff_retaddr;
  long *plVar2;
  
  plVar2 = in_RDI;
  if ((in_ESI == 0) && (*(int *)(*in_RDI + 4) == 1)) {
    pDVar1 = DSDDecoder::getLogger((DSDDecoder *)*in_RDI);
    DSDLogger::log(pDVar1,__x);
  }
  if (in_ESI % 0x24 == 0) {
    in_RDI[0xa1] = (long)&rW;
    in_RDI[0xa2] = (long)&rX;
    in_RDI[0xa3] = (long)&rY;
    in_RDI[0xa4] = (long)&rZ;
    memset((void *)(*in_RDI + 0x701e0),0,9);
  }
  *(byte *)(*in_RDI + 0xf370 + (long)*(int *)in_RDI[0xa1] * 0x18 + (long)*(int *)in_RDI[0xa2]) =
       (byte)(in_EDX >> 1) & 1;
  *(byte *)(*in_RDI + 0xf370 + (long)*(int *)in_RDI[0xa3] * 0x18 + (long)*(int *)in_RDI[0xa4]) =
       (byte)in_EDX & 1;
  in_RDI[0xa1] = in_RDI[0xa1] + 4;
  in_RDI[0xa2] = in_RDI[0xa2] + 4;
  in_RDI[0xa3] = in_RDI[0xa3] + 4;
  in_RDI[0xa4] = in_RDI[0xa4] + 4;
  storeSymbolDV(unaff_retaddr,(int)((ulong)plVar2 >> 0x20),(uchar)((ulong)plVar2 >> 0x18),
                SUB81((ulong)plVar2 >> 0x10,0));
  if (in_ESI % 0x24 == 0x23) {
    DSDMBEDecoder::processFrame
              ((DSDMBEDecoder *)(*in_RDI + 0xf490),(char (*) [23])0x0,
               (char (*) [24])(*in_RDI + 0xf370),(char (*) [24])0x0);
    *(undefined1 *)(*in_RDI + 0x701f2) = 1;
    if (*(int *)(*in_RDI + 4) == 1) {
      pDVar1 = DSDDecoder::getLogger((DSDDecoder *)*in_RDI);
      DSDLogger::log(pDVar1,__x_00);
    }
  }
  return;
}

Assistant:

void DSDdPMR::processVoiceFrame(int symbolIndex, int dibit)
{
    if ((symbolIndex == 0) && (m_dsdDecoder->m_opts.errorbars == 1))
    {
        m_dsdDecoder->getLogger().log("\nMBE: ");
    }

    if (symbolIndex % 36 == 0)
    {
        w = rW;
        x = rX;
        y = rY;
        z = rZ;
        memset((void *) m_dsdDecoder->m_mbeDVFrame1, 0, 9); // initialize DVSI frame
    }

    m_dsdDecoder->ambe_fr[*w][*x] = (1 & (dibit >> 1)); // bit 1
    m_dsdDecoder->ambe_fr[*y][*z] = (1 & dibit);        // bit 0
    w++;
    x++;
    y++;
    z++;

    storeSymbolDV(symbolIndex % 36, dibit); // store dibit for DVSI hardware decoder

    if (symbolIndex % 36 == 35)
    {
        m_dsdDecoder->m_mbeDecoder1.processFrame(0, m_dsdDecoder->ambe_fr, 0);
        m_dsdDecoder->m_mbeDVReady1 = true; // Indicate that a DVSI frame is available

        if (m_dsdDecoder->m_opts.errorbars == 1)
        {
            m_dsdDecoder->getLogger().log(".");
        }
    }
}